

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O3

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::processDG(SDGDependenciesBuilder *this,Function *F)

{
  long *plVar1;
  raw_ostream *prVar2;
  SystemDependenceGraph *pSVar3;
  raw_ostream *prVar4;
  SystemDependenceGraph *pSVar5;
  SystemDependenceGraph *pSVar6;
  Function *pFVar7;
  DepDGElement *pDVar8;
  Instruction *I;
  DGBBlock *block;
  BasicBlock *pBVar9;
  undefined8 *puVar10;
  BasicBlock *__range3;
  Function *B;
  StringRef Str;
  StringRef Str_00;
  long local_68;
  DepDGElement *local_60;
  DepDGElement *local_58;
  Function *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  long local_38;
  
  pSVar6 = *(SystemDependenceGraph **)(this->_sdg + 0x100);
  if (pSVar6 != (SystemDependenceGraph *)0x0) {
    pSVar3 = this->_sdg + 0xf8;
    pSVar5 = pSVar3;
    do {
      if (*(Function **)(pSVar6 + 0x20) >= F) {
        pSVar5 = pSVar6;
      }
      pSVar6 = *(SystemDependenceGraph **)
                (pSVar6 + (ulong)(*(Function **)(pSVar6 + 0x20) < F) * 8 + 0x10);
    } while (pSVar6 != (SystemDependenceGraph *)0x0);
    if ((pSVar5 != pSVar3) && (*(Function **)(pSVar5 + 0x20) <= F)) {
      local_68 = *(long *)(pSVar5 + 0x28);
      goto LAB_00107cfe;
    }
  }
  local_68 = 0;
LAB_00107cfe:
  pFVar7 = *(Function **)(F + 0x50);
  local_50 = F;
  do {
    if (pFVar7 == F + 0x48) {
      local_60 = *(DepDGElement **)(local_68 + 0x18);
      if (local_60 == (DepDGElement *)0x0) {
        local_60 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
      }
      plVar1 = *(long **)(this->CDA + 0x70);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x48))(&local_48,plVar1,local_50);
        if (local_48 != local_40) {
          puVar10 = local_48;
          do {
            prVar2 = (raw_ostream *)*puVar10;
            prVar4 = (raw_ostream *)llvm::errs();
            Str.Length = 7;
            Str.Data = "NORET: ";
            prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
            llvm::Value::print(prVar2,SUB81(prVar4,0));
            Str_00.Length = 1;
            Str_00.Data = "\n";
            llvm::raw_ostream::operator<<(prVar4,Str_00);
            pSVar6 = *(SystemDependenceGraph **)(this->_sdg + 0xa0);
            pSVar5 = this->_sdg + 0x98;
            do {
              if (*(raw_ostream **)(pSVar6 + 0x20) >= prVar2) {
                pSVar5 = pSVar6;
              }
              pSVar6 = *(SystemDependenceGraph **)
                        (pSVar6 + (ulong)(*(raw_ostream **)(pSVar6 + 0x20) < prVar2) * 8 + 0x10);
            } while (pSVar6 != (SystemDependenceGraph *)0x0);
            pDVar8 = *(DepDGElement **)(pSVar5 + 0x28);
            if (*(int *)&pDVar8->field_0xc < 2) {
              pDVar8 = (DepDGElement *)0x0;
            }
            if (pDVar8 == (DepDGElement *)0x0 || *(int *)&pDVar8->field_0xc != 6) {
              local_58 = pDVar8;
              std::
              _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
              ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                        ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                          *)&local_60->_control_deps,&local_58);
            }
            else {
              pDVar8 = (DepDGElement *)
                       pDVar8[1]._use_deps.super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container.
                       _M_t._M_impl.super__Rb_tree_header._M_node_count;
              local_58 = pDVar8;
              std::
              _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
              ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                        ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                          *)&local_60->_control_deps,&local_58);
            }
            local_58 = local_60;
            std::
            _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
            ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                      ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                        *)&pDVar8->_rev_control_deps,&local_58);
            puVar10 = puVar10 + 1;
          } while (puVar10 != local_40);
        }
        if (local_48 != (undefined8 *)0x0) {
          operator_delete(local_48,local_38 - (long)local_48);
        }
      }
      return;
    }
    B = pFVar7 + -0x18;
    if (pFVar7 == (Function *)0x0) {
      B = (Function *)0x0;
    }
    for (pBVar9 = *(BasicBlock **)((BasicBlock *)B + 0x30); pBVar9 != (BasicBlock *)B + 0x28;
        pBVar9 = *(BasicBlock **)(pBVar9 + 8)) {
      I = (Instruction *)(pBVar9 + -0x18);
      if (pBVar9 == (BasicBlock *)0x0) {
        I = (Instruction *)0x0;
      }
      processInstr(this,I);
    }
    pSVar6 = *(SystemDependenceGraph **)(this->_sdg + 0x130);
    if (pSVar6 == (SystemDependenceGraph *)0x0) {
LAB_00107d80:
      block = (DGBBlock *)0x0;
    }
    else {
      pSVar3 = this->_sdg + 0x128;
      pSVar5 = pSVar3;
      do {
        if (*(BasicBlock **)(pSVar6 + 0x20) >= B) {
          pSVar5 = pSVar6;
        }
        pSVar6 = *(SystemDependenceGraph **)
                  (pSVar6 + (ulong)(*(BasicBlock **)(pSVar6 + 0x20) < B) * 8 + 0x10);
      } while (pSVar6 != (SystemDependenceGraph *)0x0);
      if ((pSVar5 == pSVar3) || (B < *(BasicBlock **)(pSVar5 + 0x20))) goto LAB_00107d80;
      block = *(DGBBlock **)(pSVar5 + 0x28);
    }
    addControlDependencies(this,block,(BasicBlock *)B);
    pFVar7 = *(Function **)(pFVar7 + 8);
  } while( true );
}

Assistant:

void processDG(llvm::Function &F) {
        auto *dg = _sdg.getDG(&F);
        assert(dg && "Do not have dg");

        for (auto &B : F) {
            for (auto &I : B) {
                processInstr(I);
            }

            // block-based control dependencies
            addControlDependencies(_sdg.getBBlock(&B), B);
        }

        // add noreturn dependencies

        DBG(sdg, "Adding noreturn dependencies to " << F.getName().str());
        auto *noret = dg->getParameters().getNoReturn();
        if (!noret)
            noret = &dg->getParameters().createNoReturn();
        for (auto *dep : CDA->getNoReturns(&F)) {
            llvm::errs() << "NORET: " << *dep << "\n";
            auto *nd = sdg::DepDGElement::get(_sdg.getNode(dep));
            assert(nd && "Do not have the node");
            if (auto *C = sdg::DGNodeCall::get(nd)) {
                // if this is call, add it again to noret node
                auto *cnoret = C->getParameters().getNoReturn();
                assert(cnoret && "Did not create a noret for a call");
                noret->addControlDep(*cnoret);
            } else {
                noret->addControlDep(*nd);
            }
        }
    }